

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTest * __thiscall cmMakefile::CreateTest(cmMakefile *this,string *testName)

{
  mapped_type *ppcVar1;
  cmTest *test;
  string *testName_local;
  cmMakefile *this_local;
  
  this_local = (cmMakefile *)GetTest(this,testName);
  if (this_local == (cmMakefile *)0x0) {
    this_local = (cmMakefile *)operator_new(0x90);
    cmTest::cmTest((cmTest *)this_local,this);
    cmTest::SetName((cmTest *)this_local,testName);
    ppcVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>_>
              ::operator[](&this->Tests,testName);
    *ppcVar1 = (mapped_type)this_local;
  }
  return (cmTest *)this_local;
}

Assistant:

cmTest* cmMakefile::CreateTest(const std::string& testName)
{
  cmTest* test = this->GetTest(testName);
  if (test) {
    return test;
  }
  test = new cmTest(this);
  test->SetName(testName);
  this->Tests[testName] = test;
  return test;
}